

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedSharedMax::Run(AdvancedSharedMax *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  GLuint program;
  long lVar3;
  void *__s;
  float *__s_00;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  bool *compile_error;
  ulong uVar7;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "\nlayout(local_size_x = 1024) in;\nshared struct Type { vec4 v[2]; } g_shared[1024];\nlayout(std430) buffer Output {\n  Type g_output[1024];\n};\n\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  g_shared[id].v = vec4[2](vec4(1.0), vec4(1.0));\n  memoryBarrierShared();\n  barrier();\n\n  vec4 sum = vec4(0.0);\n  int sum_count = 0;\n  for (int i = id - 3; i < id + 4; ++i) {\n    if (id >= 0 && id < g_shared.length()) {\n      sum += g_shared[id].v[0];\n      sum += g_shared[id].v[1];\n      sum_count += 2;\n    }\n  }\n  if (any(greaterThan(abs((sum / sum_count) - vec4(1.0)), vec4(0.0000001f)))) return;\n\n  g_output[id] = g_shared[id];\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_48);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar3 = -1;
  if (bVar2) {
    __s = operator_new(0x8000);
    memset(__s,0,0x8000);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x8000,__s,0x88ea);
    operator_delete(__s,0x8000);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    __s_00 = (float *)operator_new(0x8000);
    memset(__s_00,0,0x8000);
    uVar6 = 0x8000;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x8000,__s_00);
    bVar2 = true;
    pfVar4 = __s_00;
    uVar7 = 0;
    do {
      auVar1._4_4_ = -(uint)(pfVar4[1] != 1.0);
      auVar1._0_4_ = -(uint)(*pfVar4 != 1.0);
      auVar1._8_4_ = -(uint)(pfVar4[2] != 1.0);
      auVar1._12_4_ = -(uint)(pfVar4[3] != 1.0);
      iVar5 = movmskps((int)uVar6,auVar1);
      if (iVar5 != 0) {
        anon_unknown_0::Output("Invalid data at index %d.\n");
        goto LAB_00915dc0;
      }
      bVar2 = uVar7 < 0x7ff;
      uVar6 = uVar7 + 1;
      pfVar4 = pfVar4 + 4;
      uVar7 = uVar6;
    } while (uVar6 != 0x800);
    bVar2 = false;
LAB_00915dc0:
    operator_delete(__s_00,0x8000);
    lVar3 = -(ulong)bVar2;
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1024) in;" NL
			   "shared struct Type { vec4 v[2]; } g_shared[1024];" // 32768 bytes of shared memory
			NL "layout(std430) buffer Output {" NL "  Type g_output[1024];" NL "};" NL NL "void main() {" NL
			   "  const int id = int(gl_GlobalInvocationID.x);" NL
			   "  g_shared[id].v = vec4[2](vec4(1.0), vec4(1.0));" NL "  memoryBarrierShared();" NL "  barrier();" NL NL
			   "  vec4 sum = vec4(0.0);" NL "  int sum_count = 0;" NL "  for (int i = id - 3; i < id + 4; ++i) {" NL
			   "    if (id >= 0 && id < g_shared.length()) {" NL "      sum += g_shared[id].v[0];" NL
			   "      sum += g_shared[id].v[1];" NL "      sum_count += 2;" NL "    }" NL "  }" NL
			   "  if (any(greaterThan(abs((sum / sum_count) - vec4(1.0)), vec4(0.0000001f)))) return;" NL NL
			   "  g_output[id] = g_shared[id];" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init buffer */
		{
			std::vector<vec4> data(1024 * 2);
			glGenBuffers(1, &m_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0],
						 GL_DYNAMIC_COPY);
		}

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate buffer */
		{
			std::vector<vec4> data(1024 * 2);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(1.0f)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}